

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadBarcode.cpp
# Opt level: O2

ImageView *
ZXing::SetupLumImageView
          (ImageView *__return_storage_ptr__,ImageView iv,LumImage *lum,ReaderOptions *opts)

{
  uint8_t *puVar1;
  undefined4 uVar2;
  ImageFormat IVar3;
  int iVar4;
  byte bVar5;
  invalid_argument *this;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  LumImage res;
  
  iVar8 = iv._height;
  if (iv._format == None) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid image format");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((opts->field_0x2 & 2) == 0) {
    if (iv._format == Lum) {
      if (iv._pixStride != 1) {
        Image::Image(&res.super_Image,iv._width,iv._height,Lum);
        for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
          iVar8 = iv._width;
          if (iv._width < 1) {
            iVar8 = 0;
          }
          for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
            res.super_Image.super_ImageView._data[lVar9] =
                 iv._data[(long)(int)lVar9 * (long)iv._pixStride + (long)iv._rowStride * (long)iVar6
                         ];
          }
          res.super_Image.super_ImageView._data = res.super_Image.super_ImageView._data + lVar9;
          iVar8 = iv._height;
        }
        goto LAB_0015176f;
      }
    }
    else {
      if (iv._format == RGBA) {
        if (iv._pixStride != 4) goto LAB_00151611;
        Image::Image(&res.super_Image,iv._width,iv._height,Lum);
        for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
          iVar8 = iv._width;
          if (iv._width < 1) {
            iVar8 = 0;
          }
          for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
            lVar10 = (long)iv._rowStride * (long)iVar6;
            lVar11 = (long)(int)lVar9 * (long)iv._pixStride;
            res.super_Image.super_ImageView._data[lVar9] =
                 (uint8_t)((uint)iv._data[lVar11 + 2 + lVar10] * 0x75 +
                           (uint)iv._data[lVar11 + 1 + lVar10] * 0x259 +
                           (uint)iv._data[lVar11 + lVar10] * 0x132 + 0x200 >> 10);
          }
          res.super_Image.super_ImageView._data = res.super_Image.super_ImageView._data + lVar9;
          iVar8 = iv._height;
        }
      }
      else if (iv._format == BGR) {
        if (iv._pixStride != 3) goto LAB_00151611;
        Image::Image(&res.super_Image,iv._width,iv._height,Lum);
        for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
          iVar8 = iv._width;
          if (iv._width < 1) {
            iVar8 = 0;
          }
          for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
            lVar10 = (long)iv._rowStride * (long)iVar6;
            lVar11 = (long)(int)lVar9 * (long)iv._pixStride;
            res.super_Image.super_ImageView._data[lVar9] =
                 (uint8_t)((uint)iv._data[lVar11 + lVar10] * 0x75 +
                           (uint)iv._data[lVar11 + 1 + lVar10] * 0x259 +
                           (uint)iv._data[lVar11 + 2 + lVar10] * 0x132 + 0x200 >> 10);
          }
          res.super_Image.super_ImageView._data = res.super_Image.super_ImageView._data + lVar9;
          iVar8 = iv._height;
        }
      }
      else {
        if ((iv._format != RGB) || (iv._pixStride != 3)) {
LAB_00151611:
          uVar12 = iv._format >> 0x10;
          uVar7 = iv._format >> 8;
          bVar5 = (byte)iv._format;
          Image::Image(&res.super_Image,iv._width,iv._height,Lum);
          for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
            iVar8 = iv._width;
            if (iv._width < 1) {
              iVar8 = 0;
            }
            for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
              lVar10 = (long)(int)lVar9 * (long)iv._pixStride + (long)iv._rowStride * (long)iVar6;
              res.super_Image.super_ImageView._data[lVar9] =
                   (uint8_t)((uint)iv._data[(ulong)bVar5 + lVar10] * 0x75 +
                             (uint)iv._data[(ulong)(uVar7 & 0xff) + lVar10] * 0x259 +
                             (uint)iv._data[(ulong)(uVar12 & 0xff) + lVar10] * 0x132 + 0x200 >> 10);
            }
            res.super_Image.super_ImageView._data = res.super_Image.super_ImageView._data + lVar9;
            iVar8 = iv._height;
          }
          Image::operator=(&lum->super_Image,&res.super_Image);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    (&res.super_Image._memory);
          goto LAB_00151784;
        }
        Image::Image(&res.super_Image,iv._width,iv._height,Lum);
        for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
          iVar8 = iv._width;
          if (iv._width < 1) {
            iVar8 = 0;
          }
          for (lVar9 = 0; iVar8 != (int)lVar9; lVar9 = lVar9 + 1) {
            lVar10 = (long)iv._rowStride * (long)iVar6;
            lVar11 = (long)(int)lVar9 * (long)iv._pixStride;
            res.super_Image.super_ImageView._data[lVar9] =
                 (uint8_t)((uint)iv._data[lVar11 + 2 + lVar10] * 0x75 +
                           (uint)iv._data[lVar11 + 1 + lVar10] * 0x259 +
                           (uint)iv._data[lVar11 + lVar10] * 0x132 + 0x200 >> 10);
          }
          res.super_Image.super_ImageView._data = res.super_Image.super_ImageView._data + lVar9;
          iVar8 = iv._height;
        }
      }
LAB_0015176f:
      Image::operator=(&lum->super_Image,&res.super_Image);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&res.super_Image._memory);
    }
LAB_00151784:
    if ((lum->super_Image).super_ImageView._data != (uint8_t *)0x0) goto LAB_0015178e;
  }
  lum = (LumImage *)&iv;
LAB_0015178e:
  puVar1 = ((ImageView *)lum)->_data;
  IVar3 = ((ImageView *)lum)->_format;
  iVar4 = ((ImageView *)lum)->_width;
  iVar8 = ((ImageView *)lum)->_pixStride;
  iVar6 = ((ImageView *)lum)->_rowStride;
  uVar2 = *(undefined4 *)&((ImageView *)lum)->field_0x1c;
  __return_storage_ptr__->_height = ((ImageView *)lum)->_height;
  __return_storage_ptr__->_pixStride = iVar8;
  __return_storage_ptr__->_rowStride = iVar6;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar2;
  __return_storage_ptr__->_data = puVar1;
  __return_storage_ptr__->_format = IVar3;
  __return_storage_ptr__->_width = iVar4;
  return __return_storage_ptr__;
}

Assistant:

ImageView SetupLumImageView(ImageView iv, LumImage& lum, const ReaderOptions& opts)
{
	if (iv.format() == ImageFormat::None)
		throw std::invalid_argument("Invalid image format");

	if (opts.binarizer() == Binarizer::GlobalHistogram || opts.binarizer() == Binarizer::LocalAverage) {
		// manually spell out the 3 most common pixel formats to get at least gcc to vectorize the code
		if (iv.format() == ImageFormat::RGB && iv.pixStride() == 3) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[0], src[1], src[2]); });
		} else if (iv.format() == ImageFormat::RGBA && iv.pixStride() == 4) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[0], src[1], src[2]); });
		} else if (iv.format() == ImageFormat::BGR && iv.pixStride() == 3) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[2], src[1], src[0]); });
		} else if (iv.format() != ImageFormat::Lum) {
			lum = ExtractLum(iv, [r = RedIndex(iv.format()), g = GreenIndex(iv.format()), b = BlueIndex(iv.format())](
									 const uint8_t* src) { return RGBToLum(src[r], src[g], src[b]); });
		} else if (iv.pixStride() != 1) {
			// GlobalHistogram and LocalAverage need dense line memory layout
			lum = ExtractLum(iv, [](const uint8_t* src) { return *src; });
		}
		if (lum.data())
			return lum;
	}
	return iv;
}